

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O2

string_view __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeReader::Next(CordRepBtreeReader *this)

{
  CordRep *edge;
  string_view sVar1;
  
  if (this->remaining_ == 0) {
    sVar1 = (string_view)ZEXT816(0);
  }
  else {
    edge = CordRepBtreeNavigator::Next(&this->navigator_);
    if (edge == (CordRep *)0x0) {
      __assert_fail("edge != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xb1,"absl::string_view absl::cord_internal::CordRepBtreeReader::Next()");
    }
    this->remaining_ = this->remaining_ - edge->length;
    sVar1 = EdgeData(edge);
  }
  return sVar1;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Next() {
  if (remaining_ == 0) return {};
  const CordRep* edge = navigator_.Next();
  assert(edge != nullptr);
  remaining_ -= edge->length;
  return EdgeData(edge);
}